

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexUtils.cpp
# Opt level: O0

void Ptex::v2_4::PtexUtils::anon_unknown_1::reduceTri<unsigned_char>
               (uchar *src,int sstride,int w,int param_4,uchar *dst,int dstride,int nchan)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  byte *pbVar6;
  byte *pbVar7;
  int in_EDX;
  int in_ESI;
  byte *in_RDI;
  undefined1 *in_R8;
  int in_R9D;
  int in_stack_00000008;
  uchar *pixend;
  uchar *rowend;
  uchar *end;
  int drowskip;
  int srowskip2;
  int srowskip;
  int srowinc2;
  uchar *src2;
  int rowlen;
  byte *local_30;
  undefined1 *local_20;
  byte *local_8;
  
  iVar2 = in_ESI / 1;
  iVar3 = in_EDX * in_stack_00000008;
  local_30 = in_RDI + (((long)iVar3 + (long)((in_EDX + -1) * iVar2)) - (long)in_stack_00000008);
  iVar4 = iVar2 * -2 - in_stack_00000008;
  iVar1 = in_stack_00000008 * -2;
  local_20 = in_R8;
  for (local_8 = in_RDI; local_8 != in_RDI + in_EDX * iVar2; local_8 = local_8 + (iVar2 * 2 - iVar3)
      ) {
    pbVar6 = local_8 + iVar3;
    for (; local_8 != pbVar6; local_8 = local_8 + in_stack_00000008) {
      pbVar7 = local_8 + in_stack_00000008;
      for (; local_8 != pbVar7; local_8 = local_8 + 1) {
        iVar5 = quarter<int>((uint)*local_8 + (uint)local_8[in_stack_00000008] +
                             (uint)local_8[iVar2] + (uint)*local_30);
        *local_20 = (char)iVar5;
        local_30 = local_30 + 1;
        local_20 = local_20 + 1;
      }
      local_30 = local_30 + iVar4;
    }
    local_30 = local_30 + (in_EDX * iVar2 + iVar1);
    local_20 = local_20 + (in_R9D / 1 - iVar3 / 2);
  }
  return;
}

Assistant:

inline void reduceTri(const T* src, int sstride, int w, int /*vw*/,
                          T* dst, int dstride, int nchan)
    {
        sstride /= (int)sizeof(T);
        dstride /= (int)sizeof(T);
        int rowlen = w*nchan;
        const T* src2 = src + (w-1) * sstride + rowlen - nchan;
        int srowinc2 = -2*sstride - nchan;
        int srowskip = 2*sstride - rowlen;
        int srowskip2 = w*sstride - 2 * nchan;
        int drowskip = dstride - rowlen/2;
        for (const T* end = src + w*sstride; src != end;
             src += srowskip, src2 += srowskip2, dst += drowskip)
            for (const T* rowend = src + rowlen; src != rowend; src += nchan, src2 += srowinc2)
                for (const T* pixend = src+nchan; src != pixend; src++, src2++)
                    *dst++ = T(quarter(src[0] + src[nchan] + src[sstride] + src2[0]));
    }